

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.c
# Opt level: O2

_Bool rtosc_match_char(char **path,char **pattern)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  char *pcVar4;
  char *pcVar5;
  char cVar6;
  byte bVar7;
  
  cVar1 = **path;
  pcVar5 = *pattern;
  cVar2 = *pcVar5;
  if (cVar1 == '\0' || cVar1 != cVar2) {
    if (cVar2 == '[') {
      pcVar4 = pcVar5 + 1;
      *pattern = pcVar4;
      cVar2 = pcVar5[1];
      if (cVar2 == '!') {
        pcVar4 = pcVar5 + 2;
        *pattern = pcVar4;
      }
      bVar3 = 0;
      while ((cVar6 = *pcVar4, pcVar5 = pcVar4, cVar6 != '\0' && (cVar6 != ']'))) {
        bVar7 = 1;
        if ((cVar6 != cVar1) && (bVar7 = bVar3, cVar6 == '-')) {
          pcVar5 = pcVar4 + 1;
          *pattern = pcVar5;
          cVar6 = pcVar4[1];
          if ((cVar6 == '\0') || (cVar6 == ']')) break;
          pcVar4 = pcVar5;
          bVar7 = (cVar1 <= cVar6 && ',' < cVar1) | bVar3;
        }
        pcVar4 = pcVar4 + 1;
        *pattern = pcVar4;
        bVar3 = bVar7;
      }
      if (cVar6 == ']') {
        *pattern = pcVar5 + 1;
      }
      *path = *path + 1;
      return (_Bool)(cVar2 == '!' ^ bVar3);
    }
    if (cVar2 != '?') {
      return false;
    }
  }
  *path = *path + 1;
  *pattern = *pattern + 1;
  return true;
}

Assistant:

static bool rtosc_match_char(const char **path, const char **pattern)
{
    //printf("rtosc_match_char('%s','%s')\n", *path, *pattern);
    if(**path == **pattern && **path) {
        ++*path;
        ++*pattern;
        return true;
    } else if(**pattern == '?' && *path) {
        ++*path;
        ++*pattern;
        return true;
    } else if(**pattern == '[') {
        bool matched    = false;
        bool negation   = false;
        char last_range = '\0';
        char to_match   = **path;
        ++*pattern;
        if(**pattern == '!') {
            negation = true;
            ++*pattern;
        }
        while(**pattern && **pattern != ']') {
            last_range = **pattern;
            if(**pattern == to_match) {
                matched = true;
            } else if(**pattern == '-') {//range
                ++*pattern;
                char range_high = **pattern;
                if(range_high == ']' || !range_high)
                    break;
                if(to_match <= range_high && to_match >= last_range)
                    matched = true;
            }
            ++*pattern;
        }
        if(**pattern == ']')
            ++*pattern;
        ++*path;
        return negation ^ matched;
    }
    return false;
}